

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_1::checkRenderbufferParam
               (TestContext *testCtx,CallLogWrapper *gl,GLenum pname,GLenum reference)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1a8 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetRenderbufferParameteriv(gl,0x8d41,pname,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,testCtx)
  ;
  if ((bVar1) && (state.m_value != reference)) {
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: Expected ");
    std::ostream::operator<<(this,reference);
    std::operator<<((ostream *)this,"; got ");
    std::ostream::operator<<(this,state.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkRenderbufferParam (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLenum pname, GLenum reference)
{
	StateQueryMemoryWriteGuard<GLint> state;
	gl.glGetRenderbufferParameteriv(GL_RENDERBUFFER, pname, &state);

	if (state.verifyValidity(testCtx))
		checkIntEquals(testCtx, state, reference);
}